

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDLGraphicsSystemTests.cpp
# Opt level: O0

void __thiscall
solitaire::graphics::
SDLGraphicsSystemWithLoadedTexture_throwIfSDLRenderCopyFailedDuringTextureRenderingInFullWindow_Test
::TestBody(SDLGraphicsSystemWithLoadedTexture_throwIfSDLRenderCopyFailedDuringTextureRenderingInFullWindow_Test
           *this)

{
  bool bVar1;
  WrapperMock *this_00;
  MockSpec<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&)>
  *this_01;
  TypedExpectation<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&)>
  *this_02;
  char *message;
  AssertHelper local_1a8;
  Message local_1a0 [2];
  runtime_error *anon_var_0;
  type e;
  TextureId local_160;
  byte local_159;
  undefined1 auStack_158 [7];
  bool gtest_caught_expected;
  TrueWithString gtest_msg;
  Action<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&)>
  local_128;
  WithoutMatchers local_104 [3];
  EqMatcher<std::nullopt_t> local_101;
  Matcher<const_std::optional<SDL_Rect>_&> local_100;
  EqMatcher<std::nullopt_t> local_e1;
  Matcher<const_std::optional<SDL_Rect>_&> local_e0;
  SDL_Texture_conflict *local_b8;
  Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&> local_b0;
  SDL_Renderer_conflict *local_98;
  Matcher<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&> local_90;
  MockSpec<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&)>
  local_78;
  SDLGraphicsSystemWithLoadedTexture_throwIfSDLRenderCopyFailedDuringTextureRenderingInFullWindow_Test
  *local_10;
  SDLGraphicsSystemWithLoadedTexture_throwIfSDLRenderCopyFailedDuringTextureRenderingInFullWindow_Test
  *this_local;
  
  local_10 = this;
  this_00 = &mock_ptr<testing::StrictMock<solitaire::SDL::WrapperMock>_>::operator*
                       (&(this->super_SDLGraphicsSystemWithLoadedTexture).
                         super_SDLGraphicsSystemWithCreatedWindowTests.super_SDLGraphicsSystemTests.
                         sdlMock)->super_WrapperMock;
  local_98 = (SDL_Renderer_conflict *)
             testing::no_adl::Pointer<SDL_Renderer*>
                       ((Snapshot **)&(anonymous_namespace)::rendererPtr);
  testing::internal::PointerMatcher::operator_cast_to_Matcher(&local_90,(PointerMatcher *)&local_98)
  ;
  local_b8 = (SDL_Texture_conflict *)
             testing::no_adl::Pointer<SDL_Texture*>
                       ((Snapshot **)&(anonymous_namespace)::texture0Ptr);
  testing::internal::PointerMatcher::operator_cast_to_Matcher(&local_b0,(PointerMatcher *)&local_b8)
  ;
  testing::Eq<std::nullopt_t>();
  testing::Matcher<std::optional<SDL_Rect>const&>::
  Matcher<testing::internal::EqMatcher<std::nullopt_t>,void>
            ((Matcher<std::optional<SDL_Rect>const&> *)&local_e0,&local_e1);
  testing::Eq<std::nullopt_t>();
  testing::Matcher<std::optional<SDL_Rect>const&>::
  Matcher<testing::internal::EqMatcher<std::nullopt_t>,void>
            ((Matcher<std::optional<SDL_Rect>const&> *)&local_100,&local_101);
  SDL::WrapperMock::gmock_renderCopy(&local_78,this_00,&local_90,&local_b0,&local_e0,&local_100);
  testing::internal::GetWithoutMatchers();
  this_01 = testing::internal::
            MockSpec<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&)>
            ::operator()(&local_78,local_104,(void *)0x0);
  this_02 = testing::internal::
            MockSpec<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&)>
            ::InternalExpectedAt
                      (this_01,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
                       ,0x17e,"*sdlMock",
                       "renderCopy(Pointer(rendererPtr), Pointer(texture0Ptr), Eq(std::nullopt), Eq(std::nullopt))"
                      );
  testing::Return<int>((testing *)(gtest_msg.value.field_2._M_local_buf + 8),-1);
  testing::internal::ReturnAction::operator_cast_to_Action
            (&local_128,(ReturnAction *)(gtest_msg.value.field_2._M_local_buf + 8));
  testing::internal::
  TypedExpectation<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&)>
  ::WillOnce(this_02,&local_128);
  testing::
  Action<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&)>
  ::~Action(&local_128);
  testing::internal::ReturnAction<int>::~ReturnAction
            ((ReturnAction<int> *)((long)&gtest_msg.value.field_2 + 8));
  testing::internal::
  MockSpec<int_(const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&,_const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&,_const_std::optional<SDL_Rect>_&,_const_std::optional<SDL_Rect>_&)>
  ::~MockSpec(&local_78);
  testing::Matcher<const_std::optional<SDL_Rect>_&>::~Matcher(&local_100);
  testing::Matcher<const_std::optional<SDL_Rect>_&>::~Matcher(&local_e0);
  testing::Matcher<const_std::unique_ptr<SDL_Texture,_std::function<void_(SDL_Texture_*)>_>_&>::
  ~Matcher(&local_b0);
  testing::Matcher<const_std::unique_ptr<SDL_Renderer,_std::function<void_(SDL_Renderer_*)>_>_&>::
  ~Matcher(&local_90);
  gtest_msg.value._M_string_length = 0;
  gtest_msg.value.field_2._M_allocated_capacity = 0;
  auStack_158[0] = (_Alloc_hider)0x0;
  stack0xfffffffffffffea9 = 0;
  gtest_msg.value._M_dataplus = (_Alloc_hider)0x0;
  gtest_msg.value._1_7_ = 0;
  testing::internal::TrueWithString::TrueWithString((TrueWithString *)auStack_158);
  bVar1 = testing::internal::TrueWithString::operator_cast_to_bool((TrueWithString *)auStack_158);
  if (bVar1) {
    local_159 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      TextureId::TextureId(&local_160,(TextureId *)&(anonymous_namespace)::textureId0);
      SDLGraphicsSystem::renderTextureInFullWindow
                (&(this->super_SDLGraphicsSystemWithLoadedTexture).
                  super_SDLGraphicsSystemWithCreatedWindowTests.super_SDLGraphicsSystemTests.system,
                 &local_160);
    }
    if ((local_159 & 1) != 0) goto LAB_002d6f71;
    std::__cxx11::string::operator=
              ((string *)auStack_158,
               "Expected: system.renderTextureInFullWindow(textureId0) throws an exception of type std::runtime_error.\n  Actual: it throws nothing."
              );
  }
  testing::Message::Message(local_1a0);
  message = (char *)std::__cxx11::string::c_str();
  testing::internal::AssertHelper::AssertHelper
            (&local_1a8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/SolitaireLib/unitTests/sources/graphics/SDLGraphicsSystemTests.cpp"
             ,0x180,message);
  testing::internal::AssertHelper::operator=(&local_1a8,local_1a0);
  testing::internal::AssertHelper::~AssertHelper(&local_1a8);
  testing::Message::~Message(local_1a0);
LAB_002d6f71:
  testing::internal::TrueWithString::~TrueWithString((TrueWithString *)auStack_158);
  SDLGraphicsSystemWithLoadedTexture::expectQuitSystemWithLoadedTexture
            (&this->super_SDLGraphicsSystemWithLoadedTexture);
  return;
}

Assistant:

TEST_F(SDLGraphicsSystemWithLoadedTexture,
       throwIfSDLRenderCopyFailedDuringTextureRenderingInFullWindow)
{
    EXPECT_CALL(*sdlMock,
        renderCopy(Pointer(rendererPtr), Pointer(texture0Ptr),
                   Eq(std::nullopt), Eq(std::nullopt))
    ).WillOnce(Return(failure));

    EXPECT_THROW(system.renderTextureInFullWindow(textureId0), std::runtime_error);
    expectQuitSystemWithLoadedTexture();
}